

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Runner::openStream(Runner *this)

{
  Config *pCVar1;
  ostream *poVar2;
  domain_error *this_00;
  ostringstream local_1b8 [8];
  ostringstream oss;
  string local_40 [32];
  
  pCVar1 = (this->m_config).m_p;
  if ((pCVar1->m_data).outputFilename._M_string_length == 0) {
    return;
  }
  std::ofstream::open((char *)&this->m_ofs,
                      (_Ios_Openmode)(pCVar1->m_data).outputFilename._M_dataplus._M_p);
  if (((&this->field_0x28)[*(long *)(*(long *)&this->m_ofs + -0x18)] & 5) == 0) {
    pCVar1 = (this->m_config).m_p;
    std::ios::rdbuf((streambuf *)(&pCVar1->m_os + *(long *)(*(long *)&pCVar1->m_os + -0x18)));
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b8,"Unable to open file: \'",0x16);
  pCVar1 = (this->m_config).m_p;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1b8,(pCVar1->m_data).outputFilename._M_dataplus._M_p,
                      (pCVar1->m_data).outputFilename._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,local_40);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void openStream() {
            // Open output file, if specified
            if( !m_config->getFilename().empty() ) {
                m_ofs.open( m_config->getFilename().c_str() );
                if( m_ofs.fail() ) {
                    std::ostringstream oss;
                    oss << "Unable to open file: '" << m_config->getFilename() << "'";
                    throw std::domain_error( oss.str() );
                }
                m_config->setStreamBuf( m_ofs.rdbuf() );
            }
        }